

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O2

bool __thiscall
phyr::Bounds3<double>::intersectRay
          (Bounds3<double> *this,Ray *ray,Vector3<double> *invDir,int *isDirNeg)

{
  undefined1 auVar1 [16];
  int iVar2;
  Bounds3<double> *pBVar3;
  Bounds3<double> *pBVar4;
  Bounds3<double> *pBVar5;
  Bounds3<double> *pBVar6;
  Bounds3<double> *pBVar7;
  byte bVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  pBVar5 = (Bounds3<double> *)&this->pMax;
  pBVar4 = pBVar5;
  if (*isDirNeg == 0) {
    pBVar4 = this;
  }
  pBVar3 = pBVar5;
  if (*isDirNeg == 1) {
    pBVar3 = this;
  }
  pBVar7 = pBVar5;
  if (isDirNeg[1] == 0) {
    pBVar7 = this;
  }
  pBVar6 = pBVar5;
  if (isDirNeg[1] == 1) {
    pBVar6 = this;
  }
  dVar12 = (ray->o).x;
  dVar13 = (ray->o).y;
  dVar9 = ((pBVar4->pMin).x - dVar12) * invDir->x;
  dVar10 = ((pBVar7->pMin).y - dVar13) * invDir->y;
  dVar11 = ((pBVar3->pMin).x - dVar12) * invDir->x * 1.0000000000000007;
  dVar12 = ((pBVar6->pMin).y - dVar13) * invDir->y * 1.0000000000000007;
  auVar1._8_8_ = -(ulong)(dVar12 < dVar9);
  auVar1._0_8_ = -(ulong)(dVar11 < dVar10);
  iVar2 = movmskpd((int)pBVar3,auVar1);
  if (iVar2 == 0) {
    pBVar4 = pBVar5;
    if (isDirNeg[2] == 0) {
      pBVar4 = this;
    }
    if (dVar11 <= dVar12) {
      dVar12 = dVar11;
    }
    dVar13 = (ray->o).z;
    if (isDirNeg[2] == 1) {
      pBVar5 = this;
    }
    dVar11 = ((pBVar4->pMin).z - dVar13) * invDir->z;
    bVar8 = 0;
    if (dVar11 <= dVar12) {
      if (dVar10 <= dVar9) {
        dVar10 = dVar9;
      }
      dVar13 = invDir->z * ((pBVar5->pMin).z - dVar13) * 1.0000000000000007;
      if (dVar10 <= dVar13) {
        if (dVar11 <= dVar10) {
          dVar11 = dVar10;
        }
        if (dVar12 <= dVar13) {
          dVar13 = dVar12;
        }
        bVar8 = -(0.0 < dVar13 && dVar11 < ray->tMax);
      }
    }
  }
  else {
    bVar8 = 0;
  }
  return (bool)(bVar8 & 1);
}

Assistant:

inline bool Bounds3<T>::intersectRay(const Ray& ray, const Vector3<T>& invDir,
                                     const int isDirNeg[3]) const {
    const Bounds3<T>& b = *this;
    // Test against x and y slabs
    Real tmin =  (b[  isDirNeg[0]].x - ray.o.x) * invDir.x;
    Real tmax =  (b[1-isDirNeg[0]].x - ray.o.x) * invDir.x;
    Real tymin = (b[  isDirNeg[1]].y - ray.o.y) * invDir.y;
    Real tymax = (b[1-isDirNeg[1]].y - ray.o.y) * invDir.y;

    // Adjust for cases of overlapping error bounds
    tmax *= 1 + 2 * gamma(3); tymax *= 1 + 2 * gamma(3);
    if (tymin > tmax || tymax < tmin) return false;
    if (tymin > tmin) tmin = tymin;
    if (tymax < tmax) tmax = tymax;

    // Test against z slab
    Real tzmin = (b[  isDirNeg[2]].z - ray.o.z) * invDir.z;
    Real tzmax = (b[1-isDirNeg[2]].z - ray.o.z) * invDir.z;

    // Adjust for cases of overlapping error bounds
    tzmax *= 1 + 2 * gamma(3);
    if (tzmin > tmax || tzmax < tmin) return false;
    if (tzmin > tmin) tmin = tzmin;
    if (tzmax < tmax) tmax = tzmax;

    return (tmin < ray.tMax) && (tmax > 0);
}